

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

void __thiscall pbrt::RayDifferential::ScaleDifferentials(RayDifferential *this,Float s)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar10;
  ulong uVar7;
  undefined8 uVar8;
  undefined4 uVar11;
  undefined4 uVar12;
  ulong uVar9;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  fVar1 = (this->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  fVar2 = (this->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
  uVar3 = (this->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar10 = (this->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  auVar16._4_4_ = uVar10;
  auVar16._0_4_ = uVar3;
  auVar16._8_8_ = 0;
  uVar7._0_4_ = (this->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
  uVar7._4_4_ = (this->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar7;
  auVar14 = vsubps_avx(auVar16,auVar22);
  auVar17._0_4_ = (float)(undefined4)uVar7 + auVar14._0_4_ * s;
  auVar17._4_4_ = (float)uVar7._4_4_ + auVar14._4_4_ * s;
  auVar17._8_4_ = auVar14._8_4_ * s + 0.0;
  auVar17._12_4_ = auVar14._12_4_ * s + 0.0;
  uVar8 = vmovlps_avx(auVar17);
  (this->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  (this->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar8 >> 0x20);
  (this->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar2 + (fVar1 - fVar2) * s;
  fVar1 = (this->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  uVar4 = (this->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar11 = (this->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  auVar18._4_4_ = uVar11;
  auVar18._0_4_ = uVar4;
  auVar18._8_8_ = 0;
  auVar14 = vsubps_avx(auVar18,auVar22);
  auVar19._0_4_ = (float)(undefined4)uVar7 + auVar14._0_4_ * s;
  auVar19._4_4_ = (float)uVar7._4_4_ + auVar14._4_4_ * s;
  auVar19._8_4_ = auVar14._8_4_ * s + 0.0;
  auVar19._12_4_ = auVar14._12_4_ * s + 0.0;
  uVar8 = vmovlps_avx(auVar19);
  (this->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  (this->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar8 >> 0x20);
  (this->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar2 + (fVar1 - fVar2) * s;
  fVar1 = (this->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar2 = (this->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar5 = (this->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar12 = (this->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar20._4_4_ = uVar12;
  auVar20._0_4_ = uVar5;
  auVar20._8_8_ = 0;
  uVar9._0_4_ = (this->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar9._4_4_ = (this->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar9;
  auVar14 = vsubps_avx(auVar20,auVar23);
  auVar21._0_4_ = (float)(undefined4)uVar9 + auVar14._0_4_ * s;
  auVar21._4_4_ = (float)uVar9._4_4_ + auVar14._4_4_ * s;
  auVar21._8_4_ = auVar14._8_4_ * s + 0.0;
  auVar21._12_4_ = auVar14._12_4_ * s + 0.0;
  uVar8 = vmovlps_avx(auVar21);
  (this->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar8;
  (this->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar8 >> 0x20);
  (this->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = fVar2 + (fVar1 - fVar2) * s;
  fVar1 = (this->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  uVar6 = (this->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar13 = (this->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar14._4_4_ = uVar13;
  auVar14._0_4_ = uVar6;
  auVar14._8_8_ = 0;
  auVar14 = vsubps_avx(auVar14,auVar23);
  auVar15._0_4_ = (float)(undefined4)uVar9 + auVar14._0_4_ * s;
  auVar15._4_4_ = (float)uVar9._4_4_ + auVar14._4_4_ * s;
  auVar15._8_4_ = auVar14._8_4_ * s + 0.0;
  auVar15._12_4_ = auVar14._12_4_ * s + 0.0;
  uVar8 = vmovlps_avx(auVar15);
  (this->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar8;
  (this->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar8 >> 0x20);
  (this->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = fVar2 + (fVar1 - fVar2) * s;
  return;
}

Assistant:

PBRT_CPU_GPU auto operator-(const Point3<U> &p) const
        -> Vector3<decltype(T{} - U{})> {
        DCHECK(!p.HasNaN());
        return {x - p.x, y - p.y, z - p.z};
    }